

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

MRIStepCoupling MRIStepCoupling_Copy(MRIStepCoupling MRIC)

{
  uint nmat;
  uint stages;
  realtype ***ppprVar1;
  int iVar2;
  MRIStepCoupling pMVar3;
  ulong uVar4;
  MRISTEP_METHOD_TYPE type;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (MRIC == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  if (MRIC->W == (realtype ***)0x0) {
    if (MRIC->G == (realtype ***)0x0) {
      return (MRIStepCoupling)0x0;
    }
    type = MRISTEP_IMPLICIT;
  }
  else {
    type = (uint)(MRIC->G != (realtype ***)0x0) * 2;
  }
  if (MRIC->c != (realtype *)0x0) {
    nmat = MRIC->nmat;
    stages = MRIC->stages;
    pMVar3 = MRIStepCoupling_Alloc(nmat,stages,type);
    uVar5 = 0;
    if (pMVar3 != (MRIStepCoupling)0x0) {
      iVar2 = MRIC->p;
      pMVar3->q = MRIC->q;
      pMVar3->p = iVar2;
      uVar4 = 0;
      if (0 < (int)stages) {
        uVar4 = (ulong)stages;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        pMVar3->c[uVar5] = MRIC->c[uVar5];
      }
      ppprVar1 = MRIC->W;
      if (ppprVar1 != (realtype ***)0x0) {
        uVar5 = 0;
        uVar6 = 0;
        if (0 < (int)nmat) {
          uVar6 = (ulong)nmat;
        }
        for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
          for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
            for (uVar8 = 0; stages != uVar8; uVar8 = uVar8 + 1) {
              pMVar3->W[uVar5][uVar7][uVar8] = ppprVar1[uVar5][uVar7][uVar8];
            }
          }
        }
      }
      ppprVar1 = MRIC->G;
      if (ppprVar1 != (realtype ***)0x0) {
        uVar6 = 0;
        uVar5 = (ulong)nmat;
        if ((int)nmat < 1) {
          uVar5 = uVar6;
        }
        for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
          for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
            for (uVar8 = 0; stages != uVar8; uVar8 = uVar8 + 1) {
              pMVar3->G[uVar6][uVar7][uVar8] = ppprVar1[uVar6][uVar7][uVar8];
            }
          }
        }
        return pMVar3;
      }
      return pMVar3;
    }
  }
  return (MRIStepCoupling)0x0;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Copy(MRIStepCoupling MRIC)
{
  int i, j, k, nmat, stages;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRICcopy;

  /* Check for legal input */
  if (!MRIC) return(NULL);

  /* Check for method coefficients and set method type */
  if (MRIC->W && MRIC->G)
    type = MRISTEP_IMEX;
  else if (MRIC->W && !(MRIC->G))
    type = MRISTEP_EXPLICIT;
  else if (!(MRIC->W) && MRIC->G)
    type = MRISTEP_IMPLICIT;
  else
    return(NULL);

  /* Check for stage times */
  if (!(MRIC->c)) return(NULL);

  /* Get the number of coupling matrices and stages */
  nmat   = MRIC->nmat;
  stages = MRIC->stages;

  /* Allocate coupling structure */
  MRICcopy = MRIStepCoupling_Alloc(nmat, stages, type);
  if (!MRICcopy) return(NULL);

  /* Copy method and embedding orders */
  MRICcopy->q = MRIC->q;
  MRICcopy->p = MRIC->p;

  /* Copy abscissae */
  for (i=0; i<stages; i++)
    MRICcopy->c[i] = MRIC->c[i];

  /* Copy explicit coupling matrices W */
  if (MRIC->W)
    for (k = 0; k < nmat; k++)
      for (i = 0; i < stages; i++)
        for (j = 0; j < stages; j++)
          MRICcopy->W[k][i][j] = MRIC->W[k][i][j];

  /* Copy implicit coupling matrices G */
  if (MRIC->G)
    for (k = 0; k < nmat; k++)
      for (i = 0; i < stages; i++)
        for (j = 0; j < stages; j++)
          MRICcopy->G[k][i][j] = MRIC->G[k][i][j];

  return(MRICcopy);
}